

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmanager.cpp
# Opt level: O0

string * __thiscall
ICM::ObjectPtr::to_string_abi_cxx11_(string *__return_storage_ptr__,ObjectPtr *this)

{
  Object *pOVar1;
  allocator local_19;
  ObjectPtr *local_18;
  ObjectPtr *this_local;
  
  local_18 = this;
  this_local = (ObjectPtr *)__return_storage_ptr__;
  pOVar1 = get(this);
  if (pOVar1 == (Object *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Null",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    pOVar1 = get(this);
    Object::to_string_abi_cxx11_(__return_storage_ptr__,pOVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

string ObjectPtr::to_string() const {
		if (this->get() == nullptr)
			return "Null";
		return this->get()->to_string();
	}